

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_array.h
# Opt level: O2

size_type __thiscall
bitmap::SignedBitmapArray<long>::Deserialize(SignedBitmapArray<long> *this,istream *in)

{
  size_type sVar1;
  
  std::istream::read((char *)in,(long)&(this->super_BitmapArray<long>).num_elements_);
  std::istream::read((char *)in,(long)&(this->super_BitmapArray<long>).bit_width_);
  sVar1 = Bitmap::Deserialize((Bitmap *)this,in);
  return sVar1 + 9;
}

Assistant:

typename SignedBitmapArray<T>::size_type SignedBitmapArray<T>::Deserialize(
    std::istream& in) {
  size_t in_size = 0;

  in.read(reinterpret_cast<char *>(&this->num_elements_), sizeof(size_type));
  in_size += sizeof(uint64_t);

  in.read(reinterpret_cast<char *>(&this->bit_width_), sizeof(width_type));
  in_size += sizeof(uint8_t);

  // in_size += signs_->Deserialize(in);

  in_size += Bitmap::Deserialize(in);

  return in_size;
}